

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigTiming.c
# Opt level: O2

void Aig_ManVerifyReverseLevel(Aig_Man_t *p)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  Aig_Obj_t *pObj;
  uint uVar6;
  int i;
  
  if (p->vLevelR == (Vec_Int_t *)0x0) {
    __assert_fail("p->vLevelR",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigTiming.c"
                  ,0x152,"void Aig_ManVerifyReverseLevel(Aig_Man_t *)");
  }
  uVar6 = 0;
  for (i = 0; i < p->vObjs->nSize; i = i + 1) {
    pObj = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,i);
    if ((pObj != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pObj->field_0x18 & 7) - 7)) {
      iVar2 = Aig_ObjLevel(pObj);
      iVar3 = Aig_ObjLevelNew(pObj);
      if (iVar2 != iVar3) {
        uVar1 = pObj->Id;
        uVar4 = Aig_ObjReverseLevelNew(p,pObj);
        uVar5 = Aig_ObjReverseLevel(p,pObj);
        printf("Reverse level of node %6d should be %4d instead of %4d.\n",(ulong)uVar1,(ulong)uVar4
               ,(ulong)uVar5);
        uVar6 = uVar6 + 1;
      }
    }
  }
  if (uVar6 != 0) {
    printf("Reverse levels of %d nodes are incorrect.\n",(ulong)uVar6);
    return;
  }
  return;
}

Assistant:

void Aig_ManVerifyReverseLevel( Aig_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i, Counter = 0;
    assert( p->vLevelR );
    Aig_ManForEachNode( p, pObj, i )
        if ( Aig_ObjLevel(pObj) != Aig_ObjLevelNew(pObj) )
        {
            printf( "Reverse level of node %6d should be %4d instead of %4d.\n", 
                pObj->Id, Aig_ObjReverseLevelNew(p, pObj), Aig_ObjReverseLevel(p, pObj) );
            Counter++;
        }
    if ( Counter )
    printf( "Reverse levels of %d nodes are incorrect.\n", Counter );
}